

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O3

size_t count_monsters(MyGame_Example_Monster_vec_t monsters,char *name)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  MyGame_Example_Monster_vec_t pfVar7;
  long lVar8;
  ulong uVar9;
  
  if ((monsters != (MyGame_Example_Monster_vec_t)0x0) && (uVar1 = monsters[-1], (ulong)uVar1 != 0))
  {
    lVar8 = 0;
    pfVar7 = monsters;
    do {
      uVar3 = (ulong)*pfVar7;
      lVar5 = uVar3 - (long)*(int *)((long)pfVar7 + uVar3);
      if ((*(ushort *)((long)pfVar7 + lVar5) < 0xc) ||
         (uVar9 = (ulong)*(ushort *)((long)pfVar7 + lVar5 + 10), uVar9 == 0)) {
LAB_00109088:
        __assert_fail("!(1) && \"required field missing\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                      ,0x440,
                      "flatbuffers_string_t MyGame_Example_Monster_name_get(MyGame_Example_Monster_table_t)"
                     );
      }
      lVar5 = uVar3 + uVar9;
      iVar2 = strcmp((char *)((long)pfVar7 + (ulong)*(uint *)((long)pfVar7 + lVar5) + lVar5 + 4),
                     name);
      if (iVar2 == 0) {
        uVar1 = monsters[-1];
        sVar6 = 0;
        uVar3 = -lVar8;
        do {
          sVar6 = sVar6 + 1;
          uVar9 = uVar3 + 1;
          if (uVar1 <= uVar9) {
            return sVar6;
          }
          lVar8 = uVar3 * 4 + 8;
          while( true ) {
            uVar3 = (ulong)monsters[uVar9];
            lVar5 = uVar3 - (long)*(int *)((long)monsters + uVar3 + uVar9 * 4);
            if ((*(ushort *)((long)monsters + lVar5 + uVar9 * 4) < 0xc) ||
               (uVar4 = (ulong)*(ushort *)((long)monsters + uVar9 * 4 + lVar5 + 10), uVar4 == 0))
            goto LAB_00109088;
            lVar5 = uVar3 + uVar4;
            iVar2 = strcmp((char *)((long)monsters +
                                   (ulong)*(uint *)((long)monsters + uVar9 * 4 + lVar5) +
                                   lVar5 + lVar8),name);
            if (iVar2 == 0) break;
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 4;
            if (uVar1 == uVar9) {
              return sVar6;
            }
          }
          uVar3 = uVar9;
          if (uVar9 == 0xffffffffffffffff) {
            return sVar6;
          }
        } while( true );
      }
      lVar8 = lVar8 + -1;
      pfVar7 = pfVar7 + 1;
    } while (-lVar8 != (ulong)uVar1);
  }
  return 0;
}

Assistant:

static size_t count_monsters(ns(Monster_vec_t) monsters, const char *name)
{
    size_t i;
    size_t count = 0;

    for (i = ns(Monster_vec_scan)(monsters, name);
         i != nsc(not_found);
         i = ns(Monster_vec_scan_ex)(monsters, i + 1, nsc(end), name)) {
        ++count;
    }

    return count;
}